

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFileWriter.cpp
# Opt level: O1

ssize_t __thiscall AudioFileWriter::write(AudioFileWriter *this,int __fd,void *__buf,size_t __n)

{
  QDebug this_00;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ushort *puVar5;
  undefined4 in_register_00000034;
  undefined8 *puVar6;
  uint uVar7;
  QByteArrayView QVar8;
  qint16 cnvBuffer [8192];
  ushort *local_40a0;
  QDebug local_4098;
  QArrayData *local_4090;
  undefined8 *local_4088;
  ulong local_4078;
  uint local_406c;
  AudioFileWriter *local_4068;
  ushort *local_4060;
  undefined4 local_4058;
  undefined8 local_4054;
  undefined8 uStack_404c;
  undefined4 local_4044;
  char *local_4040;
  ushort local_4038 [8196];
  
  local_40a0 = (ushort *)CONCAT44(in_register_00000034,__fd);
  uVar2 = QIODevice::isOpen();
  if ((char)uVar2 == '\0') {
    uVar2 = 0;
  }
  else {
    local_4078 = (ulong)__buf & 0xffffffff;
    if (this->skipSilence == true) {
      if ((int)__buf != 0) {
        uVar2 = 0;
        do {
          if (*(int *)((long)local_40a0 + uVar2) != 0) {
            this->skipSilence = false;
            local_4078 = ((ulong)__buf & 0xffffffff) * 4 - uVar2 >> 2;
            local_40a0 = (ushort *)((long)local_40a0 + uVar2);
            goto LAB_0012c247;
          }
          lVar4 = uVar2 + 4;
          uVar2 = uVar2 + 4;
        } while ((ushort *)((long)local_40a0 + lVar4) < local_40a0 + ((ulong)__buf & 0xffffffff) * 2
                );
      }
      local_4078 = 0;
    }
LAB_0012c247:
    local_4068 = this;
    do {
      uVar7 = (uint)local_4078;
      local_406c = (uint)CONCAT71((int7)(uVar2 >> 8),uVar7 == 0);
      if (uVar7 == 0) break;
      uVar1 = 0x1000;
      if (uVar7 < 0x1000) {
        uVar1 = uVar7;
      }
      puVar5 = local_40a0;
      if (local_4068->waveMode == false) {
        if (0xfff < (local_4078 & 0xffffffff)) {
          uVar7 = 0x1000;
        }
        lVar4 = 0;
        do {
          local_4038[lVar4] = local_40a0[lVar4] << 8 | local_40a0[lVar4] >> 8;
          lVar4 = lVar4 + 1;
        } while (uVar7 * 2 != (int)lVar4);
        puVar5 = local_4038;
        uVar7 = uVar1;
      }
      uVar2 = (ulong)(uVar7 * 4);
      do {
        uVar3 = uVar2;
        if ((long)uVar3 < 1) {
          local_40a0 = local_40a0 + uVar7 * 2;
          uVar2 = (ulong)((int)local_4078 - uVar7);
          local_4078 = uVar2;
          break;
        }
        lVar4 = QIODevice::write((char *)&this->file,(longlong)puVar5);
        if (lVar4 == -1) {
          local_4058 = 2;
          local_4054 = 0;
          uStack_404c = 0;
          local_4044 = 0;
          local_4040 = "default";
          local_4060 = puVar5;
          QMessageLogger::debug();
          this_00.stream = local_4098.stream;
          QVar8.m_data = (storage_type *)0x33;
          QVar8.m_size = (qsizetype)&local_4090;
          QString::fromUtf8(QVar8);
          QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)&local_4090);
          if (local_4090 != (QArrayData *)0x0) {
            LOCK();
            (local_4090->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_4090->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_4090->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_4090,2,8);
            }
          }
          if (*(QTextStream *)(local_4098.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_4098.stream,' ');
          }
          QIODevice::errorString();
          puVar6 = local_4088;
          if (local_4088 == (undefined8 *)0x0) {
            puVar6 = &QString::_empty;
          }
          QDebug::putString((QChar *)&local_4098,(ulong)puVar6);
          if (*(QTextStream *)(local_4098.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_4098.stream,' ');
          }
          puVar5 = local_4060;
          if (local_4090 != (QArrayData *)0x0) {
            LOCK();
            (local_4090->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_4090->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_4090->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_4090,2,8);
            }
          }
          QDebug::~QDebug(&local_4098);
          QFileDevice::close();
          uVar2 = uVar3;
        }
        else {
          puVar5 = (ushort *)((long)puVar5 + lVar4);
          uVar2 = uVar3 - lVar4;
        }
      } while (lVar4 != -1);
    } while ((long)uVar3 < 1);
    uVar2 = (ulong)local_406c;
  }
  return uVar2;
}

Assistant:

bool AudioFileWriter::write(const qint16 *buffer, uint totalFrames) {
	static const uint MAX_FRAMES_PER_RUN = 4096;

	if (!file.isOpen()) return false;

	const qint32 *startPos = (const qint32 *)buffer;
	if (skipSilence) {
		const qint32 *endPos = startPos + totalFrames;
		totalFrames = 0;
		for (const qint32 *p = startPos; p < endPos; p++) {
			if (*p != 0) {
				skipSilence = false;
				totalFrames = endPos - p;
				buffer = (const qint16 *)p;
				break;
			}
		}
	}

	qint16 cnvBuffer[MAX_FRAMES_PER_RUN << 1];
	while (totalFrames > 0) {
		uint framesToWrite = qMin(MAX_FRAMES_PER_RUN, totalFrames);
		bool converted = convertSamplesFromNativeEndian(buffer, cnvBuffer, framesToWrite << 1, waveMode ? QSysInfo::LittleEndian : QSysInfo::BigEndian);
		if (!converted) framesToWrite = totalFrames;

		const char *bufferPos = (const char *)(converted ? cnvBuffer : buffer);
		qint64 bytesToWrite = framesToWrite * FRAME_SIZE;
		while (bytesToWrite > 0) {
			qint64 bytesWritten = file.write(bufferPos, bytesToWrite);
			if (bytesWritten == -1) {
				qDebug() << "AudioFileWriter: error writing into the audio file:" << file.errorString();
				file.close();
				return false;
			}
			bytesToWrite -= bytesWritten;
			bufferPos += bytesWritten;
		}
		buffer += framesToWrite << 1;
		totalFrames -= framesToWrite;
	}
	return true;
}